

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O1

int Amap_LibFindMux(Amap_Lib_t *p,int iFan0,int iFan1,int iFan2)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = p->vRules3->nSize;
  uVar4 = (ulong)iVar1;
  if (0 < (long)uVar4) {
    piVar2 = p->vRules3->pArray;
    uVar5 = 2;
    do {
      if (piVar2[uVar5 - 2] == iFan0) {
        if (uVar4 <= uVar5 - 1) goto LAB_004479eb;
        if (piVar2[uVar5 - 1] == iFan1) {
          if (uVar4 <= uVar5) {
LAB_004479eb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (piVar2[uVar5] == iFan2) {
            if ((int)(uVar5 + 1) < iVar1) {
              return piVar2[uVar5 + 1 & 0xffffffff];
            }
            goto LAB_004479eb;
          }
        }
      }
      iVar3 = (int)uVar5;
      uVar5 = uVar5 + 4;
    } while (iVar3 + 2 < iVar1);
  }
  return -1;
}

Assistant:

int Amap_LibFindMux( Amap_Lib_t * p, int iFan0, int iFan1, int iFan2 )
{
    int x;
    for ( x = 0; x < Vec_IntSize(p->vRules3); x += 4 )
    {
        if ( Vec_IntEntry(p->vRules3, x)   == iFan0 &&
             Vec_IntEntry(p->vRules3, x+1) == iFan1 &&
             Vec_IntEntry(p->vRules3, x+2) == iFan2 )
        {
            return Vec_IntEntry(p->vRules3, x+3);
        }
    }
    return -1;
}